

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kernel_type.hpp
# Opt level: O1

void __thiscall
ExchCXX::detail::BuiltinKernelImpl<ExchCXX::BuiltinM062X_X,void>::
eval_exc_<int&,double_const*&,double_const*&,double_const*&,double_const*&,double*&>
          (BuiltinKernelImpl<ExchCXX::BuiltinM062X_X,void> *this,int *args,double **args_1,
          double **args_2,double **args_3,double **args_4,double **args_5)

{
  uint N;
  const_host_buffer_type rho;
  const_host_buffer_type sigma;
  const_host_buffer_type tau;
  host_buffer_type eps;
  long lVar1;
  
  N = *args;
  rho = *args_1;
  sigma = *args_2;
  tau = *args_4;
  eps = *args_5;
  if (*(int *)(this + 8) != 0) {
    if (0 < (int)N) {
      lVar1 = 0;
      do {
        mgga_screening_interface<ExchCXX::BuiltinM062X_X>::eval_exc_unpolar
                  (*(double *)((long)rho + lVar1),*(double *)((long)sigma + lVar1),0.0,
                   *(double *)((long)tau + lVar1),(double *)((long)eps + lVar1));
        lVar1 = lVar1 + 8;
      } while ((ulong)N << 3 != lVar1);
    }
    return;
  }
  host_eval_exc_helper_polar<ExchCXX::BuiltinM062X_X>(N,rho,sigma,*args_3,tau,eps);
  return;
}

Assistant:

void eval_exc_(Args&&... args) const {
    if( is_polarized() )
      host_eval_exc_helper_polar<KernelType>(
        std::forward<Args>(args)...
      );
    else
      host_eval_exc_helper_unpolar<KernelType>(
        std::forward<Args>(args)...
      );
  }